

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdfastpfor.h
# Opt level: O1

void __thiscall
FastPForLib::SIMDSimplePFor<FastPForLib::Simple8b<true>_>::__encodeArray
          (SIMDSimplePFor<FastPForLib::Simple8b<true>_> *this,uint32_t *in,size_t length,
          uint32_t *out,size_t *nvalue)

{
  ulong uVar1;
  pointer puVar2;
  iterator __position;
  pointer __src;
  uint32_t *in_00;
  byte bVar3;
  uint32_t *puVar4;
  __m128i *palVar5;
  ulong uVar6;
  uint uVar7;
  byte *pbVar8;
  ulong uVar9;
  uint32_t k;
  long lVar10;
  uint32_t *puVar11;
  ulong __n;
  uint8_t bestb;
  uint8_t bestcexcept;
  uint8_t maxb;
  size_t outcap;
  byte local_67;
  byte local_66;
  uint8_t local_65;
  uint local_64;
  uint32_t *local_60;
  size_t *local_58;
  uint32_t *local_50;
  __m128i *local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  size_t local_38;
  
  local_58 = nvalue;
  checkifdivisibleby(length,0x80);
  puVar2 = (this->datatobepacked).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->datatobepacked).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_finish != puVar2) {
    (this->datatobepacked).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  palVar5 = (__m128i *)(out + 1);
  pbVar8 = (this->bytescontainer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_60 = out;
  if (0x7f < (long)length) {
    local_40 = &this->datatobepacked;
    local_50 = in + length;
    puVar11 = in + 0x80;
    do {
      local_48 = palVar5;
      getBestBFromData(this,in,&local_67,&local_66,&local_65);
      bVar3 = local_67;
      *pbVar8 = local_67;
      pbVar8[1] = local_66;
      pbVar8 = pbVar8 + 2;
      if (local_66 != 0) {
        lVar10 = 0;
        do {
          if (in[lVar10] >> (bVar3 & 0x1f) != 0) {
            local_64 = in[lVar10] >> (local_67 & 0x1f);
            __position._M_current =
                 (this->datatobepacked).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->datatobepacked).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(local_40,__position,&local_64);
            }
            else {
              *__position._M_current = local_64;
              (this->datatobepacked).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
              ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            *pbVar8 = (byte)lVar10;
            pbVar8 = pbVar8 + 1;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x80);
      }
      palVar5 = local_48;
      usimdpack(in,local_48,(uint)local_67);
      palVar5 = palVar5 + local_67;
      puVar11 = puVar11 + 0x80;
      in = in + 0x80;
    } while (puVar11 <= local_50);
  }
  puVar4 = local_60;
  *local_60 = (uint32_t)((ulong)((long)palVar5 - (long)local_60) >> 2);
  __src = (this->bytescontainer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start;
  uVar7 = (int)pbVar8 - (int)__src;
  puVar11 = (uint32_t *)((long)*palVar5 + 4);
  *(uint *)*palVar5 = uVar7;
  __n = (ulong)uVar7;
  memcpy(puVar11,__src,__n);
  uVar9 = __n + 3 & 0xfffffffffffffffc;
  if (__n < uVar9) {
    uVar1 = (long)*palVar5 + __n + 5;
    uVar6 = (long)*palVar5 + uVar9 + 4;
    if (uVar6 < uVar1) {
      uVar6 = uVar1;
    }
    memset((void *)((long)puVar11 + __n),0,(uVar6 - ((long)*palVar5 + __n)) - 4);
  }
  local_38 = 0;
  in_00 = (this->datatobepacked).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start;
  Simple8b<true>::encodeArray
            (&this->ecoder,in_00,
             (long)(this->datatobepacked).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)in_00 >> 2,
             (uint32_t *)((long)puVar11 + uVar9),&local_38);
  *local_58 = (long)((long)((long)puVar11 + uVar9) + (local_38 * 4 - (long)puVar4)) >> 2;
  return;
}

Assistant:

void __encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                     size_t &nvalue) {
    uint32_t *const initout = out; // keep track of this
    checkifdivisibleby(length, BlockSize);
    uint32_t *const headerout = out++; // keep track of this
    datatobepacked.clear();
    uint8_t *bc = &bytescontainer[0];
    for (const uint32_t *const final = in + length; (in + BlockSize <= final);
         in += BlockSize) {
      uint8_t bestb, bestcexcept, maxb;
      getBestBFromData(in, bestb, bestcexcept, maxb);
      *bc++ = bestb;
      *bc++ = bestcexcept;
      if (bestcexcept > 0) {
        assert(bestb < 32);
        const uint32_t maxval = 1U << bestb;
        for (uint32_t k = 0; k < BlockSize; ++k) {
          if (in[k] >= maxval) {
            datatobepacked.push_back(in[k] >> bestb);
            *bc++ = static_cast<uint8_t>(k);
          }
        }
      }
      assert(BlockSize == 128);
      usimdpack(in, reinterpret_cast<__m128i *>(out), bestb);
      out += BlockSizeInUnitsOfPackSize * bestb;
      // out = packblockup<BlockSize>(in, out, bestb);
    }
    headerout[0] = static_cast<uint32_t>(out - headerout);
    const uint32_t bytescontainersize =
        static_cast<uint32_t>(bc - &bytescontainer[0]);
    *(out++) = bytescontainersize;
    memcpy(out, &bytescontainer[0], bytescontainersize);
    uint8_t* pad8 = (uint8_t*)out + bytescontainersize;
    out += (bytescontainersize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    while (pad8 < (uint8_t*)out)
        *pad8++ = 0; // clear padding bytes

    size_t outcap = 0;
    ecoder.encodeArray(datatobepacked.data(), datatobepacked.size(), out,
                       outcap);
    out += outcap;
    nvalue = out - initout;
  }